

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSClassID JS_NewClassID(JSClassID *pclass_id)

{
  JSClassID JVar1;
  JSClassID class_id;
  JSClassID *pclass_id_local;
  
  class_id = *pclass_id;
  if (class_id == 0) {
    class_id = js_class_id_alloc;
    JVar1 = js_class_id_alloc + 1;
    *pclass_id = js_class_id_alloc;
    js_class_id_alloc = JVar1;
  }
  return class_id;
}

Assistant:

JSClassID JS_NewClassID(JSClassID *pclass_id)
{
    JSClassID class_id;
    /* XXX: make it thread safe */
    class_id = *pclass_id;
    if (class_id == 0) {
        class_id = js_class_id_alloc++;
        *pclass_id = class_id;
    }
    return class_id;
}